

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O2

Component __thiscall
ftxui::ResizableSplitBottom(ftxui *this,Component *main,Component *back,int *main_size)

{
  ComponentBase *pCVar1;
  pointer p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar3;
  Component CVar4;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  __allocator_type __a2;
  allocator_type local_c1;
  ComponentBase *local_c0;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ResizableSplitBottomBase,_std::allocator<ftxui::(anonymous_namespace)::ResizableSplitBottomBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_b8;
  Component local_a8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_88;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_78;
  undefined8 local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_60 = 0;
  p_Var2 = (pointer)operator_new(0x88);
  local_b8._M_alloc = &__a2;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001688c0;
  local_c0 = (ComponentBase *)&p_Var2->_M_impl;
  local_b8._M_ptr = p_Var2;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&main->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&back->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__ResizableSplitBottomBase_00168910;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28),&local_88);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x38),&local_98);
  *(int **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x48) = main_size;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x50) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x58) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x60) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x68) = 0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x70) = 0;
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&local_98);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&local_88);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_50;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_78,__l,&local_c1);
  Container::Vertical((Container *)&local_a8,&local_78);
  pCVar1 = local_c0;
  ComponentBase::Add(local_c0,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_78);
  lVar3 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_50._M_ptr + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  local_b8._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ResizableSplitBottomBase,_std::allocator<ftxui::(anonymous_namespace)::ResizableSplitBottomBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_b8);
  *(ComponentBase **)this = pCVar1;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(this + 8) = p_Var2;
  local_60 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component ResizableSplitBottom(Component main, Component back, int* main_size) {
  return Make<ResizableSplitBottomBase>(std::move(main), std::move(back),
                                        main_size);
}